

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O0

void __thiscall xe::ri::ImageSet::ImageSet(ImageSet *this)

{
  ImageSet *this_local;
  
  Item::Item(&this->super_Item,TYPE_IMAGESET);
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__ImageSet_0013d8d8;
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::string((string *)&this->description);
  List::List(&this->images);
  return;
}

Assistant:

ImageSet		(void) : Item(TYPE_IMAGESET) {}